

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O2

void __thiscall
InlineeFrameRecord::Restore
          (InlineeFrameRecord *this,FunctionBody *functionBody,InlinedFrameLayout *inlinedFrame,
          JavascriptCallStackLayout *layout,bool boxValues)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BOOLEAN BVar4;
  uint uVar5;
  LocalFunctionId LVar6;
  int iVar7;
  undefined4 *puVar8;
  Var aValue;
  ScriptFunction *this_00;
  FunctionBody *pFVar9;
  undefined4 extraout_var;
  InlineeCallInfo aValue_00;
  RecyclableObject *ptr;
  uint i;
  ulong uVar10;
  uint uVar11;
  
  if (this->inlineDepth == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd3,"(this->inlineDepth != 0)","this->inlineDepth != 0");
    if (!bVar2) goto LAB_0050fbbe;
    *puVar8 = 0;
  }
  if (this->inlineeStartOffset == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd4,"(inlineeStartOffset != 0)","inlineeStartOffset != 0");
    if (!bVar2) goto LAB_0050fbbe;
    *puVar8 = 0;
  }
  if (DAT_0145948a == '\x01') {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
    if (bVar2) {
      Output::Print(L"Restore function object: ");
    }
  }
  aValue = Restore(this,this->functionOffset,false,false,layout,functionBody,boxValues);
  bVar2 = Js::VarIs<Js::ScriptFunction>(aValue);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                       ,0xd9,"(Js::VarIs<Js::ScriptFunction>(varFunction))",
                       "Js::VarIs<Js::ScriptFunction>(varFunction)");
    if (!bVar2) {
LAB_0050fbbe:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar8 = 0;
  }
  this_00 = Js::VarTo<Js::ScriptFunction>(aValue);
  if (DAT_0145948a == '\x01') {
    uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
    if (bVar2) {
      pFVar9 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      iVar7 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar9);
      pFVar9 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar9);
      pFVar9 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this_00);
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar9);
      Output::Print(L"Inlinee: %s [%d.%d] \n",CONCAT44(extraout_var,iVar7),(ulong)uVar5,(ulong)LVar6
                   );
    }
  }
  inlinedFrame->function = (JavascriptFunction *)this_00;
  (inlinedFrame->callInfo).InlineeStartOffset = this->inlineeStartOffset;
  uVar11 = *(uint *)&inlinedFrame->callInfo & 0xfffffff0 | this->argCount & 0xf;
  *(uint *)&inlinedFrame->callInfo = uVar11;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar10 = 0;
  do {
    if ((uVar11 & 0xf) <= uVar10) {
      inlinedFrame->arguments = (Var)0x0;
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,BailOutPhase,uVar5,LVar6);
      if (!bVar2) {
        uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
        if (!bVar2) {
          return;
        }
      }
      Output::Flush();
      return;
    }
    BVar3 = BVUnitT<unsigned_long>::Test(&this->floatArgs,(BVIndex)uVar10);
    BVar4 = BVUnitT<unsigned_long>::Test(&this->losslessInt32Args,(BVIndex)uVar10);
    if (DAT_0145948a == '\x01') {
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      LVar6 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,BailOutPhase,uVar5,LVar6);
      if (bVar2) {
        Output::Print(L"Restore argument %d: ",uVar10 & 0xffffffff);
      }
    }
    aValue_00 = (InlineeCallInfo)
                Restore(this,this->argOffsets[uVar10],BVar3 != '\0',BVar4 != '\0',layout,
                        functionBody,boxValues);
    if (boxValues) {
      bVar2 = Js::TaggedNumber::Is((Var)aValue_00);
      if (!bVar2) {
        ptr = Js::VarTo<Js::RecyclableObject>((Var)aValue_00);
        bVar2 = ThreadContext::IsOnStack(ptr);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                             ,0xed,"(!ThreadContext::IsOnStack(recyclableObject))",
                             "!ThreadContext::IsOnStack(recyclableObject)");
          if (!bVar2) goto LAB_0050fbbe;
          *puVar8 = 0;
        }
      }
    }
    (&inlinedFrame[1].callInfo)[uVar10] = aValue_00;
    uVar10 = uVar10 + 1;
    uVar11 = *(uint *)&inlinedFrame->callInfo;
  } while( true );
}

Assistant:

void InlineeFrameRecord::Restore(Js::FunctionBody* functionBody, InlinedFrameLayout *inlinedFrame, Js::JavascriptCallStackLayout * layout, bool boxValues) const
{
    Assert(this->inlineDepth != 0);
    Assert(inlineeStartOffset != 0);

    BAILOUT_VERBOSE_TRACE(functionBody, _u("Restore function object: "));
    // No deepCopy needed for just the function
    Js::Var varFunction = this->Restore(this->functionOffset, /*isFloat64*/ false, /*isInt32*/ false, layout, functionBody, boxValues);
    Assert(Js::VarIs<Js::ScriptFunction>(varFunction));

    Js::ScriptFunction* function = Js::VarTo<Js::ScriptFunction>(varFunction);
    BAILOUT_VERBOSE_TRACE(functionBody, _u("Inlinee: %s [%d.%d] \n"), function->GetFunctionBody()->GetDisplayName(), function->GetFunctionBody()->GetSourceContextId(), function->GetFunctionBody()->GetLocalFunctionId());

    inlinedFrame->function = function;
    inlinedFrame->callInfo.InlineeStartOffset = inlineeStartOffset;
    inlinedFrame->callInfo.Count = this->argCount;
    inlinedFrame->MapArgs([=](uint i, Js::Var* varRef) {
        bool isFloat64 = floatArgs.Test(i) != 0;
        bool isInt32 = losslessInt32Args.Test(i) != 0;
        BAILOUT_VERBOSE_TRACE(functionBody, _u("Restore argument %d: "), i);

        // Forward deepCopy flag for the arguments in case their data must be guaranteed
        // to have its own lifetime
        Js::Var var = this->Restore(this->argOffsets[i], isFloat64, isInt32, layout, functionBody, boxValues);
#if DBG
        if (boxValues && !Js::TaggedNumber::Is(var))
        {
            Js::RecyclableObject *const recyclableObject = Js::VarTo<Js::RecyclableObject>(var);
            Assert(!ThreadContext::IsOnStack(recyclableObject));
        }
#endif
        *varRef = var;
    });
    inlinedFrame->arguments = nullptr;
    BAILOUT_FLUSH(functionBody);
}